

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void WI_initShowNextLoc(void)

{
  if (wbs->next_ep != -1) {
    state = ShowNextLoc;
    acceleratestage = 0;
    cnt = 0x8c;
    WI_LoadBackground(true);
    return;
  }
  WI_End();
  G_WorldDone();
  return;
}

Assistant:

void WI_initShowNextLoc ()
{
	if (wbs->next_ep == -1) 
	{
		// Last map in episode - there is no next location!
		WI_End();
		G_WorldDone();
		return;
	}

	state = ShowNextLoc;
	acceleratestage = 0;
	cnt = SHOWNEXTLOCDELAY * TICRATE;
	WI_LoadBackground(true);
}